

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

EGLint eglu::getRenderableAPIsMask(Library *egl,EGLDisplay display)

{
  uint uVar1;
  uint uVar2;
  pointer ppvVar3;
  vector<void_*,_std::allocator<void_*>_> configs;
  vector<void_*,_std::allocator<void_*>_> local_38;
  
  getConfigs(&local_38,egl,display);
  if (local_38.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_38.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    ppvVar3 = local_38.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar1 = getConfigAttribInt(egl,display,*ppvVar3,0x3040);
      uVar2 = uVar2 | uVar1;
      ppvVar3 = ppvVar3 + 1;
    } while (ppvVar3 !=
             local_38.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_38.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

EGLint getRenderableAPIsMask (const eglw::Library& egl, eglw::EGLDisplay display)
{
	const vector<EGLConfig>	configs	= getConfigs(egl, display);
	EGLint					allAPIs	= 0;

	for (vector<EGLConfig>::const_iterator i = configs.begin(); i != configs.end(); ++i)
		allAPIs |= getConfigAttribInt(egl, display, *i, EGL_RENDERABLE_TYPE);

	return allAPIs;
}